

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTcEmbedBuilderDbl::lead_node(CTcEmbedBuilderDbl *this)

{
  CTPNDstr *this_00;
  size_t in_RSI;
  
  if ((G_tok->curtok_).text_len_ == 0) {
    this_00 = (CTPNDstr *)0x0;
  }
  else {
    this_00 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,in_RSI);
    CTPNDstr::CTPNDstr(this_00,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_);
  }
  return (CTcPrsNode *)this_00;
}

Assistant:

virtual CTcPrsNode *lead_node()
    {
        /* 
         *   Create a node for the initial part of the string.  This is just
         *   an ordinary double-quoted string node. If the initial part of
         *   the string is zero-length, don't create an initial node at all,
         *   since this would just generate do-nothing code.  
         */
        if (G_tok->getcur()->get_text_len() != 0)
        {
            /* create the node for the initial part of the string */
            return new CTPNDstr(G_tok->getcur()->get_text(),
                                G_tok->getcur()->get_text_len());
        }
        else
        {
            /* 
             *   the initial part of the string is empty, so we don't need a
             *   node for this portion 
             */
            return 0;
        }
    }